

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Expr::Expr(Expr *this,Var *left,Var *right)

{
  uint32_t var_width;
  int iVar1;
  undefined4 extraout_var;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  string local_58;
  allocator<char> local_31;
  
  iVar1 = (*(left->super_IRNode)._vptr_IRNode[0xd])(left);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_31);
  var_width = left->var_width_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,&left->size_);
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar1),&local_58,var_width,
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,left->is_signed_,
           Expression);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002aa170;
  this->op = Add;
  this->left = left;
  this->right = right;
  (this->super_Var).type_ = Expression;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(left->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(left->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish,(allocator_type *)&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&(this->super_Var).size_,&local_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  set_parent(this);
  return;
}

Assistant:

Expr::Expr(Var *left, Var *right)
    : Var(left->generator(), "", left->var_width(), left->size(), left->is_signed(),
          VarType::Expression),
      op(ExprOp::Add),
      left(left),
      right(right) {
    type_ = VarType::Expression;
    size_ = std::vector<uint32_t>(left->size().begin(), left->size().end());
    set_parent();
}